

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void CP_ReaderRegisterHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  SstStream Stream;
  void *__ptr;
  void *pvVar1;
  
  ps_register_thread_();
  if (_perfstubs_initialized == 1) {
    pvVar1 = CP_ReaderRegisterHandler::timer;
    if (CP_ReaderRegisterHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                                          ,"CP_ReaderRegisterHandler",0x9a2);
      pvVar1 = (void *)ps_timer_create_(__ptr);
      CP_ReaderRegisterHandler::timer = pvVar1;
      free(__ptr);
    }
    ps_timer_start_(pvVar1);
  }
  Stream = *Msg_v;
  CMtake_buffer(cm,Msg_v);
  queueReaderRegisterMsgAndNotify(Stream,(_ReaderRegisterMsg *)Msg_v,conn);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_ReaderRegisterHandler::timer);
    return;
  }
  return;
}

Assistant:

void CP_ReaderRegisterHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                              attr_list attrs)
{
    PERFSTUBS_REGISTER_THREAD();
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    struct _ReaderRegisterMsg *Msg = (struct _ReaderRegisterMsg *)Msg_v;
    //    fprintf(stderr,
    //            "Received a reader registration message directed at writer
    //            %p\n",
    //            Msg->writer_file);
    //    fprintf(stderr, "A reader cohort of size %d is requesting to be
    //    added\n",
    //            Msg->ReaderCohortSize);
    //    for (int i = 0; i < Msg->ReaderCohortSize; i++) {
    //        fprintf(stderr, " rank %d CP contact info: %s, %d, %p\n", i,
    //                Msg->CP_ReaderInfo[i]->ContactInfo,
    //                Msg->CP_ReaderInfo[i]->target_stone,
    //                Msg->CP_ReaderInfo[i]->ReaderID);
    //    }
    Stream = Msg->WriterFile;

    //    printf("WRITER network handler PID is %lx, TID %lx in reader register
    //    "
    //           "handler\n",
    //           (long)getpid(), (long)gettid());
    /* arrange for this message data to stay around */
    CMtake_buffer(cm, Msg);

    queueReaderRegisterMsgAndNotify(Stream, Msg, conn);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}